

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Color.cpp
# Opt level: O1

string * __thiscall Color::colorize(string *__return_storage_ptr__,Color *this,string *input)

{
  pointer pcVar1;
  ostream *poVar2;
  uint uVar3;
  char cVar4;
  stringstream result;
  stringstream asStack_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  if (this->_value == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar1 = (input->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar1,pcVar1 + input->_M_string_length);
  }
  else {
    std::__cxx11::stringstream::stringstream(asStack_1b8);
    if ((this->_value >> 0x15 & 1) == 0) {
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\x1b[",2);
      uVar3 = this->_value;
      cVar4 = (uVar3 >> 0x11 & 1) != 0;
      if ((bool)cVar4) {
        std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"1",1);
      }
      if ((this->_value & 0x40000) != 0) {
        if ((uVar3 >> 0x11 & 1) != 0) {
          std::__ostream_insert<char,std::char_traits<char>>(local_1a8,";",1);
        }
        std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"4",1);
        cVar4 = cVar4 + '\x01';
      }
      if ((this->_value & 0x400000) != 0) {
        if (cVar4 != '\0') {
          std::__ostream_insert<char,std::char_traits<char>>(local_1a8,";",1);
        }
        std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"7",1);
        cVar4 = cVar4 + '\x01';
      }
      if ((this->_value & 0x80000) != 0) {
        if (cVar4 != '\0') {
          std::__ostream_insert<char,std::char_traits<char>>(local_1a8,";",1);
        }
        cVar4 = '\x01';
        std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
      }
      if ((this->_value & 0x100000) != 0) {
        if (cVar4 != '\0') {
          std::__ostream_insert<char,std::char_traits<char>>(local_1a8,";",1);
        }
        std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
      }
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"m",1);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (local_1a8,(input->_M_dataplus)._M_p,input->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\x1b[0m",4);
      std::__cxx11::stringbuf::str();
    }
    else {
      uVar3 = this->_value & 0x40000;
      if (uVar3 != 0) {
        std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\x1b[4m",4);
      }
      if ((this->_value & 0x400000) == 0) {
        cVar4 = (char)(uVar3 >> 0x12);
      }
      else {
        cVar4 = '\x01';
        std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\x1b[7m",4);
      }
      if ((this->_value & 0x80000) != 0) {
        std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\x1b[38;5;",7);
        poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
        cVar4 = '\x01';
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,"m",1);
      }
      if ((this->_value & 0x100000) != 0) {
        std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\x1b[48;5;",7);
        poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
        cVar4 = '\x01';
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,"m",1);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                (local_1a8,(input->_M_dataplus)._M_p,input->_M_string_length);
      if (cVar4 != '\0') {
        std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\x1b[0m",4);
      }
      std::__cxx11::stringbuf::str();
    }
    std::__cxx11::stringstream::~stringstream(asStack_1b8);
    std::ios_base::~ios_base(local_138);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Color::colorize (const std::string& input)
{
#ifdef FEATURE_COLOR
  if (!nontrivial ())
    return input;

  int count = 0;
  std::stringstream result;

  // 256 color
  if (_value & _COLOR_256)
  {
    bool needTerminator = false;

    if (_value & _COLOR_UNDERLINE)
    {
      result << "\033[4m";
      needTerminator = true;
    }

    if (_value & _COLOR_INVERSE)
    {
      result << "\033[7m";
      needTerminator = true;
    }

    if (_value & _COLOR_HASFG)
    {
      result << "\033[38;5;" << (_value & _COLOR_FG) << "m";
      needTerminator = true;
    }

    if (_value & _COLOR_HASBG)
    {
      result << "\033[48;5;" << ((_value & _COLOR_BG) >> 8) << "m";
      needTerminator = true;
    }

    result << input;
    if (needTerminator)
      result << "\033[0m";

    return result.str ();
  }

  // 16 color
  else
  {
    result << "\033[";

    if (_value & _COLOR_BOLD)
    {
      if (count++) result << ";";
      result << "1";
    }

    if (_value & _COLOR_UNDERLINE)
    {
      if (count++) result << ";";
      result << "4";
    }

    if (_value & _COLOR_INVERSE)
    {
      if (count++) result << ";";
      result << "7";
    }

    if (_value & _COLOR_HASFG)
    {
      if (count++) result << ";";
      result << (29 + (_value & _COLOR_FG));
    }

    if (_value & _COLOR_HASBG)
    {
      if (count++) result << ";";
      result << ((_value & _COLOR_BRIGHT ? 99 : 39) + ((_value & _COLOR_BG) >> 8));
    }

    result << "m" << input << "\033[0m";
    return result.str ();
  }
#endif

  return input;
}